

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int uv_signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum)

{
  uint *puVar1;
  uint uVar2;
  uv_signal_s *puVar3;
  uv_signal_t *puVar4;
  uv_signal_s *puVar5;
  int iVar6;
  uv_signal_t *puVar7;
  int *piVar8;
  uv_signal_s *puVar9;
  uv_signal_t *puVar10;
  uv__signal_tree_s *puVar11;
  long lVar12;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar13;
  uv_signal_s *puVar14;
  sigset_t saved_sigmask;
  sigaction local_c8;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!(handle->flags & (UV_CLOSING | UV_CLOSED))","src/unix/signal.c",0x123,
                  "int uv_signal_start(uv_signal_t *, uv_signal_cb, int)");
  }
  if (signum == 0) {
    iVar6 = -0x16;
  }
  else if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    iVar6 = 0;
  }
  else {
    if (handle->signum != 0) {
      uv__signal_stop(handle);
    }
    uv__signal_block_and_lock(&saved_sigmask);
    puVar7 = uv__signal_first_handle(signum);
    if (puVar7 == (uv_signal_t *)0x0) {
      memset(&local_c8,0,0x98);
      iVar6 = sigfillset(&local_c8.sa_mask);
      if (iVar6 != 0) {
        abort();
      }
      local_c8.__sigaction_handler.sa_handler = uv__signal_handler;
      iVar6 = sigaction(signum,&local_c8,(sigaction *)0x0);
      if (iVar6 != 0) {
        piVar8 = __errno_location();
        iVar6 = *piVar8;
        if (iVar6 != 0) {
          uv__signal_unlock_and_unblock(&saved_sigmask);
          return -iVar6;
        }
      }
    }
    handle->signum = signum;
    iVar6 = 0;
    puVar11 = &uv__signal_tree;
    puVar9 = (uv_signal_t *)0x0;
    while (puVar7 = puVar11->rbh_root, puVar7 != (uv_signal_t *)0x0) {
      iVar6 = uv__signal_compare(handle,puVar7);
      lVar12 = 0x50;
      if ((-1 < iVar6) && (lVar12 = 0x58, iVar6 == 0)) goto LAB_0010e36f;
      puVar9 = puVar7;
      puVar11 = (uv__signal_tree_s *)((long)puVar7->handle_queue + lVar12 + -0x20);
    }
    (handle->tree_entry).rbe_parent = puVar9;
    (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_color = 1;
    puVar11 = &uv__signal_tree;
    if (puVar9 != (uv_signal_t *)0x0) {
      if (iVar6 < 0) {
        puVar11 = (uv__signal_tree_s *)&puVar9->tree_entry;
      }
      else {
        puVar11 = (uv__signal_tree_s *)&(puVar9->tree_entry).rbe_right;
      }
    }
    ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar11)->rbe_left = handle;
    puVar7 = handle;
    while ((puVar9 != (uv_signal_t *)0x0 && ((puVar9->tree_entry).rbe_color == 1))) {
      puVar3 = (puVar9->tree_entry).rbe_parent;
      puVar14 = (puVar3->tree_entry).rbe_left;
      puVar10 = puVar7;
      if (puVar9 == puVar14) {
        puVar5 = (puVar3->tree_entry).rbe_right;
        if ((puVar5 != (uv_signal_s *)0x0) && ((puVar5->tree_entry).rbe_color == 1)) {
          (puVar5->tree_entry).rbe_color = 0;
          goto LAB_0010e1fb;
        }
        puVar4 = (puVar9->tree_entry).rbe_right;
        if (puVar4 == puVar7) {
          puVar14 = (puVar4->tree_entry).rbe_left;
          (puVar9->tree_entry).rbe_right = puVar14;
          if (puVar14 == (uv_signal_s *)0x0) {
            (puVar4->tree_entry).rbe_parent = puVar3;
            puVar14 = (puVar9->tree_entry).rbe_parent;
LAB_0010e2ee:
            puVar11 = (uv__signal_tree_s *)&(puVar14->tree_entry).rbe_right;
            if (puVar9 == (puVar14->tree_entry).rbe_left) {
              puVar11 = (uv__signal_tree_s *)&puVar14->tree_entry;
            }
          }
          else {
            (puVar14->tree_entry).rbe_parent = puVar9;
            puVar14 = (puVar9->tree_entry).rbe_parent;
            (puVar4->tree_entry).rbe_parent = puVar14;
            puVar11 = &uv__signal_tree;
            if (puVar14 != (uv_signal_s *)0x0) goto LAB_0010e2ee;
          }
          ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar11)->rbe_left = puVar4;
          (puVar4->tree_entry).rbe_left = puVar9;
          (puVar9->tree_entry).rbe_parent = puVar4;
          puVar14 = (puVar3->tree_entry).rbe_left;
          puVar10 = puVar9;
          puVar9 = puVar7;
        }
        (puVar9->tree_entry).rbe_color = 0;
        (puVar3->tree_entry).rbe_color = 1;
        puVar9 = (puVar14->tree_entry).rbe_right;
        (puVar3->tree_entry).rbe_left = puVar9;
        if (puVar9 != (uv_signal_s *)0x0) {
          (puVar9->tree_entry).rbe_parent = puVar3;
        }
        puVar9 = (puVar3->tree_entry).rbe_parent;
        (puVar14->tree_entry).rbe_parent = puVar9;
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        if (puVar9 != (uv_signal_s *)0x0) {
          paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar9->tree_entry).rbe_right;
          if (puVar3 == (puVar9->tree_entry).rbe_left) {
            paVar13 = &puVar9->tree_entry;
          }
        }
        paVar13->rbe_left = puVar14;
        (puVar14->tree_entry).rbe_right = puVar3;
        (puVar3->tree_entry).rbe_parent = puVar14;
      }
      else if ((puVar14 == (uv_signal_s *)0x0) || ((puVar14->tree_entry).rbe_color != 1)) {
        puVar4 = (puVar9->tree_entry).rbe_left;
        if (puVar4 == puVar7) {
          puVar14 = (puVar4->tree_entry).rbe_right;
          (puVar9->tree_entry).rbe_left = puVar14;
          if (puVar14 == (uv_signal_s *)0x0) {
            (puVar4->tree_entry).rbe_parent = puVar3;
            puVar14 = (puVar9->tree_entry).rbe_parent;
LAB_0010e27b:
            puVar11 = (uv__signal_tree_s *)&(puVar14->tree_entry).rbe_right;
            if (puVar9 == (puVar14->tree_entry).rbe_left) {
              puVar11 = (uv__signal_tree_s *)&puVar14->tree_entry;
            }
          }
          else {
            (puVar14->tree_entry).rbe_parent = puVar9;
            puVar14 = (puVar9->tree_entry).rbe_parent;
            (puVar4->tree_entry).rbe_parent = puVar14;
            puVar11 = &uv__signal_tree;
            if (puVar14 != (uv_signal_s *)0x0) goto LAB_0010e27b;
          }
          ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar11)->rbe_left = puVar4;
          (puVar4->tree_entry).rbe_right = puVar9;
          (puVar9->tree_entry).rbe_parent = puVar4;
          puVar10 = puVar9;
          puVar9 = puVar7;
        }
        (puVar9->tree_entry).rbe_color = 0;
        (puVar3->tree_entry).rbe_color = 1;
        puVar9 = (puVar3->tree_entry).rbe_right;
        puVar14 = (puVar9->tree_entry).rbe_left;
        (puVar3->tree_entry).rbe_right = puVar14;
        if (puVar14 != (uv_signal_s *)0x0) {
          (puVar14->tree_entry).rbe_parent = puVar3;
        }
        puVar14 = (puVar3->tree_entry).rbe_parent;
        (puVar9->tree_entry).rbe_parent = puVar14;
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        if (puVar14 != (uv_signal_s *)0x0) {
          paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar14->tree_entry).rbe_right;
          if (puVar3 == (puVar14->tree_entry).rbe_left) {
            paVar13 = &puVar14->tree_entry;
          }
        }
        paVar13->rbe_left = puVar9;
        (puVar9->tree_entry).rbe_left = puVar3;
        (puVar3->tree_entry).rbe_parent = puVar9;
      }
      else {
        (puVar14->tree_entry).rbe_color = 0;
LAB_0010e1fb:
        (puVar9->tree_entry).rbe_color = 0;
        (puVar3->tree_entry).rbe_color = 1;
        puVar10 = puVar3;
      }
      puVar7 = puVar10;
      puVar9 = (puVar10->tree_entry).rbe_parent;
    }
    ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_0010e36f:
    uv__signal_unlock_and_unblock(&saved_sigmask);
    handle->signal_cb = signal_cb;
    uVar2 = handle->flags;
    iVar6 = 0;
    if (((uVar2 >> 0xe & 1) == 0) &&
       (handle->flags = uVar2 | 0x4000, iVar6 = 0, (uVar2 >> 0xd & 1) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar6;
}

Assistant:

int uv_signal_start(uv_signal_t* handle, uv_signal_cb signal_cb, int signum) {
  sigset_t saved_sigmask;
  int err;

  assert(!(handle->flags & (UV_CLOSING | UV_CLOSED)));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return -EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small time
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   */
  if (uv__signal_first_handle(signum) == NULL) {
    err = uv__signal_register_handler(signum);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}